

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O2

void lws_sul_timed_callback_vh_protocol_cb(lws_sorted_usec_list_t *sul)

{
  lws_dll2 *plVar1;
  lws_dll2_owner *plVar2;
  long lVar3;
  lws_dll2 *plVar4;
  long lVar5;
  
  plVar1 = sul[1].list.next;
  plVar2 = plVar1[0xd].owner;
  lVar5 = (long)*(int *)((long)&sul[1].list.owner + 4) * 0x188;
  lVar3 = *(long *)((long)plVar2 + lVar5 + 0x298);
  *(lws_dll2_owner **)(lVar3 + 0x1f8) = plVar2;
  *(lws_dll2 **)(lVar3 + 0x200) = plVar1;
  plVar4 = sul[1].list.prev;
  *(lws_dll2 **)(lVar3 + 0x228) = plVar4;
  _lws_log(0x10,"%s: timed cb: vh %s, protocol %s, reason %d\n",
           "lws_sul_timed_callback_vh_protocol_cb",plVar1[0xf].prev,plVar4->prev,
           (ulong)*(uint *)&sul[1].list.owner);
  (*(code *)(sul[1].list.prev)->next)
            (*(undefined8 *)((long)plVar2 + lVar5 + 0x298),*(undefined4 *)&sul[1].list.owner,0,0,0);
  __lws_timed_callback_remove((lws_vhost *)sul[1].list.next,(lws_timed_vh_protocol *)&sul[-1].us);
  return;
}

Assistant:

void
lws_sul_timed_callback_vh_protocol_cb(lws_sorted_usec_list_t *sul)
{
	struct lws_timed_vh_protocol *tvp = lws_container_of(sul,
					struct lws_timed_vh_protocol, sul);
	struct lws_context_per_thread *pt =
				&tvp->vhost->context->pt[tvp->tsi_req];

	pt->fake_wsi->context = tvp->vhost->context;

	pt->fake_wsi->vhost = tvp->vhost; /* not a real bound wsi */
	pt->fake_wsi->protocol = tvp->protocol;

	lwsl_debug("%s: timed cb: vh %s, protocol %s, reason %d\n", __func__,
		   tvp->vhost->name, tvp->protocol->name, tvp->reason);

	tvp->protocol->callback(pt->fake_wsi, tvp->reason, NULL, NULL, 0);

	__lws_timed_callback_remove(tvp->vhost, tvp);
}